

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Put_field(int g_a,int *lo,int *hi,int foff,int fsize,void *buf,int *ld)

{
  long lVar1;
  long lVar2;
  Integer _ld [7];
  Integer _ahi [7];
  Integer _alo [7];
  Integer local_e8 [7];
  long lStack_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  lVar1 = pnga_ndim((long)g_a);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      (&lStack_70)[lVar2] = (long)*lo + 1;
      lo = lo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    lVar2 = lVar1;
    if (0 < lVar1) {
      do {
        (&lStack_b0)[lVar2] = (long)*hi + 1;
        hi = hi + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      for (; lVar1 != 1; lVar1 = lVar1 + -1) {
        local_e8[lVar1 + -2] = (long)*ld + 1;
        ld = ld + 1;
      }
    }
  }
  pnga_put_field((long)g_a,local_68,local_a8,(long)foff,(long)fsize,buf,local_e8);
  return;
}

Assistant:

void NGA_Put_field(int g_a, int *lo, int *hi, int foff, int fsize,
		   void *buf, int *ld) {
  Integer a = (Integer)g_a;
  Integer andim = wnga_ndim(a);
  Integer _alo[MAXDIM], _ahi[MAXDIM];
  Integer _ld[MAXDIM];
  COPYINDEX_C2F(lo,_alo, andim);
  COPYINDEX_C2F(hi,_ahi, andim);
  COPYINDEX_C2F(ld, _ld, andim-1);

  wnga_put_field(a, _alo, _ahi, foff, fsize, buf, _ld);
}